

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prepared_statement_data.cpp
# Opt level: O2

void __thiscall
duckdb::PreparedStatementData::CheckParameterCount
          (PreparedStatementData *this,idx_t parameter_count)

{
  unsigned_long params;
  BinderException *this_00;
  allocator local_41;
  string local_40;
  
  params = (this->properties).parameter_count;
  if (params == parameter_count) {
    return;
  }
  this_00 = (BinderException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_40,
             "Parameter/argument count mismatch for prepared statement. Expected %llu, got %llu",
             &local_41);
  BinderException::BinderException<unsigned_long,unsigned_long>
            (this_00,&local_40,params,parameter_count);
  __cxa_throw(this_00,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void PreparedStatementData::CheckParameterCount(idx_t parameter_count) {
	const auto required = properties.parameter_count;
	if (parameter_count != required) {
		throw BinderException("Parameter/argument count mismatch for prepared statement. Expected %llu, got %llu",
		                      required, parameter_count);
	}
}